

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall pugi::xml_document::_destroy(xml_document *this)

{
  long lVar1;
  xml_node_struct *pxVar2;
  xml_document *pxVar3;
  ulong uVar4;
  xml_node_struct *pxVar5;
  
  pxVar2 = (this->super_xml_node)._root;
  if (pxVar2 == (xml_node_struct *)0x0) {
    __assert_fail("_root",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x1b0f,"void pugi::xml_document::_destroy()");
  }
  if (this->_buffer != (char_t *)0x0) {
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              ();
    this->_buffer = (char_t *)0x0;
    pxVar2 = (this->super_xml_node)._root;
  }
  pxVar5 = pxVar2[1].parent;
  if (pxVar5 != (xml_node_struct *)0x0) {
    do {
      if (pxVar5->header != 0) {
        (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                  deallocate)();
      }
      pxVar5 = (xml_node_struct *)pxVar5->name;
    } while (pxVar5 != (xml_node_struct *)0x0);
    pxVar2 = (this->super_xml_node)._root;
  }
  uVar4 = pxVar2->header >> 8;
  if (*(long *)((long)pxVar2 + (8 - uVar4)) != 0) {
    __assert_fail("root_page && !root_page->prev",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x1b20,"void pugi::xml_document::_destroy()");
  }
  pxVar3 = (xml_document *)((long)pxVar2 - uVar4);
  if ((this->_memory <= pxVar3) && (pxVar3 < this + 1)) {
    lVar1 = *(long *)pxVar3->_memory;
    while (lVar1 != 0) {
      lVar1 = *(long *)(lVar1 + 0x10);
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )();
    }
    (this->super_xml_node)._root = (xml_node_struct *)0x0;
    return;
  }
  __assert_fail("reinterpret_cast<char*>(root_page) >= _memory && reinterpret_cast<char*>(root_page) < _memory + sizeof(_memory)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                ,0x1b21,"void pugi::xml_document::_destroy()");
}

Assistant:

PUGI__FN void xml_document::_destroy()
	{
		assert(_root);

		// destroy static storage
		if (_buffer)
		{
			impl::xml_memory::deallocate(_buffer);
			_buffer = 0;
		}

		// destroy extra buffers (note: no need to destroy linked list nodes, they're allocated using document allocator)
		for (impl::xml_extra_buffer* extra = static_cast<impl::xml_document_struct*>(_root)->extra_buffers; extra; extra = extra->next)
		{
			if (extra->buffer) impl::xml_memory::deallocate(extra->buffer);
		}

		// destroy dynamic storage, leave sentinel page (it's in static memory)
		impl::xml_memory_page* root_page = PUGI__GETPAGE(_root);
		assert(root_page && !root_page->prev);
		assert(reinterpret_cast<char*>(root_page) >= _memory && reinterpret_cast<char*>(root_page) < _memory + sizeof(_memory));

		for (impl::xml_memory_page* page = root_page->next; page; )
		{
			impl::xml_memory_page* next = page->next;

			impl::xml_allocator::deallocate_page(page);

			page = next;
		}

	#ifdef PUGIXML_COMPACT
		// destroy hash table
		static_cast<impl::xml_document_struct*>(_root)->hash.clear();
	#endif

		_root = 0;
	}